

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O3

ModeSense __thiscall SCSI::Target::CommandState::mode_sense_specs(CommandState *this)

{
  pointer puVar1;
  uint uVar2;
  long lVar3;
  ModeSense MVar4;
  
  puVar1 = (this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 == 10) {
    uVar2 = (uint)(ushort)(*(ushort *)(puVar1 + 7) << 8 | *(ushort *)(puVar1 + 7) >> 8);
  }
  else {
    uVar2 = 0;
    if (lVar3 == 6) {
      uVar2 = (uint)puVar1[4];
    }
  }
  MVar4.page_control_values._1_3_ = 0;
  MVar4._0_5_ = CONCAT14(puVar1[2] >> 5,(uint)(puVar1[1] >> 3)) & 0xff00000001;
  MVar4._8_4_ = puVar1[2] & 0x3f | (uint)puVar1[3] << 8 | uVar2 << 0x10;
  return MVar4;
}

Assistant:

CommandState::ModeSense CommandState::mode_sense_specs() const {
	ModeSense specs;

	specs.exclude_block_descriptors = (data_[1] & 0x08);
	specs.page_control_values = ModeSense::PageControlValues(data_[2] >> 5);
	specs.page_code = data_[2] & 0x3f;
	specs.subpage_code = data_[3];
	specs.allocated_bytes = number_of_blocks();

	return specs;
}